

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.c
# Opt level: O2

void al_set_bitmap_blender(int op,int src,int dest)

{
  al_get_target_bitmap();
  al_set_separate_bitmap_blender(op,src,dest,op,src,dest);
  return;
}

Assistant:

void al_set_bitmap_blender(int op, int src, int dest)
{
   ALLEGRO_BITMAP *bitmap = al_get_target_bitmap();

   ASSERT(bitmap);

   al_set_separate_bitmap_blender(op, src, dest, op, src, dest);
}